

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

statement_ptr __thiscall mjs::parser::parse_statement(parser *this,bool check_for_strict_mode)

{
  uint uVar1;
  token *this_00;
  pointer pwVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  undefined8 extraout_RAX;
  wstring *pwVar8;
  wostream *pwVar9;
  char *pcVar10;
  char in_DL;
  wchar_t *extraout_RDX;
  wstring_view *s;
  pointer *__ptr;
  undefined7 in_register_00000031;
  parser *this_01;
  undefined1 auVar11 [8];
  undefined1 auVar12 [8];
  wchar_t *in_R9;
  wstring_view message;
  wstring_view message_00;
  wstring_view id;
  wstring_view name;
  wstring catch_id;
  wstring n;
  wostringstream _oss;
  position_stack_node _statement_position__LINE__;
  undefined1 local_628 [16];
  pointer local_618;
  undefined1 local_608 [16];
  undefined8 local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_5e0;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [32];
  undefined1 local_598 [8];
  undefined1 local_590 [8];
  undefined1 local_588 [8];
  element_type aeStack_580 [5];
  ulong local_418;
  position_stack_node local_410;
  token local_3f0;
  token local_3c8;
  token local_3a0;
  token local_378;
  token local_350;
  token local_328;
  token local_300;
  token local_2d8;
  token local_2b0;
  token local_288;
  token local_260;
  token local_238;
  token local_210;
  token local_1e8;
  token local_1c0;
  token local_198;
  token local_170;
  token local_148;
  token local_120;
  token local_f8;
  token local_d0;
  token local_a8;
  token local_80;
  token local_58;
  
  this_01 = (parser *)CONCAT71(in_register_00000031,check_for_strict_mode);
  local_410.stack_ = &this_01->statement_pos_;
  pcVar10 = (char *)this_01->statement_pos_;
  this_01->statement_pos_ = &local_410;
  local_410.pos_ = this_01->token_start_;
  local_410.parent_ = this_01;
  local_410.prev_ = (position_stack_node *)pcVar10;
  if ((this_01->current_token_).type_ == lbrace) {
    parse_block(this,check_for_strict_mode);
    goto LAB_00176d47;
  }
  iVar7 = (int)this_01;
  accept((parser *)local_590,iVar7,(sockaddr *)0x4d,(socklen_t *)pcVar10);
  uVar5 = local_590._0_4_;
  token::destroy((token *)local_590);
  if (uVar5 != 0x72) {
    local_608._0_8_ =
         (this_01->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_608._8_8_ =
         (this_01->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_)->_M_use_count + 1;
      }
    }
    local_5f8 = (pointer)CONCAT44((int)(this_01->lexer_).text_pos_,this_01->token_start_);
    expect((token *)local_590,this_01,identifier,"parse_statement",0x350);
    if ((local_590._0_4_ != 2) && (local_590._0_4_ != 4)) {
LAB_00177c1c:
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    local_628._0_8_ = &local_618;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)local_628,local_588,
               (wchar_t *)((long)local_588 + aeStack_580[0]._0_8_ * 4));
    token::destroy((token *)local_590);
    parse_function_abi_cxx11_
              ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                *)local_590,this_01);
    iVar7 = (**(code **)((long)&(*(pointer *)local_590)->field_2 + 8))();
    if (iVar7 != 0) {
      __assert_fail("block->type() == statement_type::block",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                    ,0x352,"statement_ptr mjs::parser::parse_statement(bool)");
    }
    if (*(char *)((long)local_590 + 0x38) == '\x01') {
      id._M_str = (wchar_t *)local_628._0_8_;
      id._M_len = local_628._8_8_;
      check_function_name(this_01,id,(source_extend *)local_608);
    }
    make_statement<mjs::function_definition,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(source_extend *)this_01,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               &aeStack_580[0].filename_._M_string_length,
               (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_628,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_588);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aeStack_580[0].filename_.field_2._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 aeStack_580[0].filename_.field_2._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_588);
    if (local_590 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)local_590)->_M_string_length)();
    }
    if ((pointer *)local_628._0_8_ != &local_618) {
      operator_delete((void *)local_628._0_8_,(long)local_618 * 4 + 4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_);
    }
    goto LAB_00176d47;
  }
  accept((parser *)local_590,iVar7,(sockaddr *)0x6c,(socklen_t *)pcVar10);
  uVar5 = local_590._0_4_;
  token::destroy((token *)local_590);
  if (uVar5 != 0x72) {
    parse_variable_declaration_list((list *)local_590,this_01);
    expect_semicolon_allow_insertion(this_01,"parse_statement",0x359);
    make_statement<mjs::variable_statement,std::vector<mjs::declaration,std::allocator<mjs::declaration>>>
              (this,(vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)this_01);
    std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::~vector
              ((vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)local_590);
    goto LAB_00176d47;
  }
  this_00 = &this_01->current_token_;
  if (this_00->type_ == semicolon) {
    get_token(&local_58,this_01);
    token::destroy(&local_58);
    make_statement<mjs::empty_statement>(this);
    goto LAB_00176d47;
  }
  accept((parser *)local_590,iVar7,(sockaddr *)0x4f,(socklen_t *)pcVar10);
  uVar5 = local_590._0_4_;
  token::destroy((token *)local_590);
  if (uVar5 == 0x72) {
    accept((parser *)local_590,iVar7,(sockaddr *)0x42,(socklen_t *)pcVar10);
    uVar5 = local_590._0_4_;
    token::destroy((token *)local_590);
    if (uVar5 == 0x72) {
      accept((parser *)local_590,iVar7,(sockaddr *)0x6f,(socklen_t *)pcVar10);
      uVar5 = local_590._0_4_;
      token::destroy((token *)local_590);
      if (uVar5 == 0x72) {
        accept((parser *)local_590,iVar7,(sockaddr *)0x4c,(socklen_t *)pcVar10);
        uVar5 = local_590._0_4_;
        token::destroy((token *)local_590);
        if (uVar5 != 0x72) {
          local_628._0_8_ =
               (__uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>)0x0;
          local_608._0_8_ =
               (__uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>)0x0;
          local_5c8._0_8_ = (element_type *)0x0;
          pcVar10 = "parse_statement";
          expect(&local_1c0,this_01,lparen,"parse_statement",0x376);
          token::destroy(&local_1c0);
          accept((parser *)local_590,iVar7,(sockaddr *)0x34,(socklen_t *)pcVar10);
          uVar5 = local_590._0_4_;
          token::destroy((token *)local_590);
          if (uVar5 == 0x72) {
            this_01->supress_in_ = true;
            accept((parser *)local_590,iVar7,(sockaddr *)0x6c,(socklen_t *)pcVar10);
            uVar5 = local_590._0_4_;
            token::destroy((token *)local_590);
            if (uVar5 == 0x72) {
              parse_expression((parser *)&local_5e0);
              make_statement<mjs::expression_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                        ((parser *)local_590,
                         (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                         this_01);
              auVar11 = local_590;
              uVar3 = local_628._0_8_;
              local_590 = (undefined1  [8])0x0;
              local_628._0_8_ = auVar11;
              if (((_Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>)uVar3
                   != (statement *)0x0) &&
                 ((*(code *)(*(pointer *)uVar3)->_M_string_length)(),
                 local_590 != (undefined1  [8])0x0)) {
                (**(code **)(*(long *)local_590 + 8))();
              }
              local_590 = (undefined1  [8])0x0;
              if ((element_type *)local_5e0._M_allocated_capacity != (element_type *)0x0) {
                (*(code *)(*(pointer *)local_5e0._M_allocated_capacity)->_M_string_length)();
              }
            }
            else {
              parse_variable_declaration_list((list *)local_590,this_01);
              make_statement<mjs::variable_statement,std::vector<mjs::declaration,std::allocator<mjs::declaration>>>
                        ((parser *)&local_5e0,
                         (vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)this_01);
              uVar4 = local_5e0._M_allocated_capacity;
              uVar3 = local_628._0_8_;
              local_5e0._M_allocated_capacity = 0;
              local_628._0_8_ = uVar4;
              if (((_Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>)uVar3
                   != (statement *)0x0) &&
                 ((*(code *)(*(pointer *)uVar3)->_M_string_length)(),
                 (long *)local_5e0._M_allocated_capacity != (long *)0x0)) {
                (**(code **)(*(long *)local_5e0._M_allocated_capacity + 8))();
              }
              local_5e0._M_allocated_capacity = 0;
              std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::~vector
                        ((vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)local_590);
            }
            this_01->supress_in_ = false;
            accept((parser *)local_590,iVar7,(sockaddr *)0x52,(socklen_t *)pcVar10);
            uVar5 = local_590._0_4_;
            token::destroy((token *)local_590);
            if (uVar5 != 0x72) {
              iVar7 = (**(code **)((long)&(*(pointer *)local_628._0_8_)->field_2 + 8))();
              if ((iVar7 == 1) &&
                 ((long)(((statement *)(local_628._0_8_ + 0x20))->super_syntax_node).extend_.file.
                        super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                  (long)(((statement *)(local_628._0_8_ + 0x20))->super_syntax_node).
                        _vptr_syntax_node != 0x28)) {
                unhandled(this_01,"parse_statement",899);
              }
              parse_expression((parser *)local_590);
              expect(&local_1e8,this_01,rparen,"parse_statement",0x387);
              token::destroy(&local_1e8);
              parse_statement((parser *)&local_5e0,check_for_strict_mode);
              make_statement<mjs::for_in_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                        (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                              this_01,
                         (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                         local_628,
                         (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                         local_590);
              auVar11 = local_590;
              if ((element_type *)local_5e0._M_allocated_capacity != (element_type *)0x0) {
                (*(code *)(*(pointer *)local_5e0._M_allocated_capacity)->_M_string_length)();
                auVar11 = local_590;
              }
              goto LAB_00176f55;
            }
            pcVar10 = "parse_statement";
            expect(&local_210,this_01,semicolon,"parse_statement",0x38a);
            token::destroy(&local_210);
          }
          accept((parser *)local_590,iVar7,(sockaddr *)0x34,(socklen_t *)pcVar10);
          uVar5 = local_590._0_4_;
          token::destroy((token *)local_590);
          if (uVar5 == 0x72) {
            parse_expression((parser *)local_590);
            local_608._0_8_ = local_590;
            pcVar10 = "parse_statement";
            expect(&local_238,this_01,semicolon,"parse_statement",0x38e);
            token::destroy(&local_238);
          }
          accept((parser *)local_590,iVar7,(sockaddr *)0x2f,(socklen_t *)pcVar10);
          uVar5 = local_590._0_4_;
          token::destroy((token *)local_590);
          if (uVar5 == 0x72) {
            parse_expression((parser *)local_590);
            local_5c8._0_8_ = local_590;
            expect(&local_260,this_01,rparen,"parse_statement",0x392);
            token::destroy(&local_260);
          }
          parse_statement((parser *)local_590,check_for_strict_mode);
          make_statement<mjs::for_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                    (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                          this_01,
                     (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_628
                     ,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                      local_608,
                     (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_5c8);
          auVar11 = (undefined1  [8])local_5c8._0_8_;
          if (local_590 != (undefined1  [8])0x0) {
            (*(code *)(*(pointer *)local_590)->_M_string_length)();
            auVar11 = (undefined1  [8])local_5c8._0_8_;
          }
          goto LAB_00176f55;
        }
        accept((parser *)local_590,iVar7,(sockaddr *)0x3e,(socklen_t *)pcVar10);
        uVar5 = local_590._0_4_;
        token::destroy((token *)local_590);
        if (uVar5 == 0x72) {
          accept((parser *)local_590,iVar7,(sockaddr *)0x37,(socklen_t *)pcVar10);
          uVar5 = local_590._0_4_;
          token::destroy((token *)local_590);
          if (uVar5 == 0x72) {
            accept((parser *)local_590,iVar7,(sockaddr *)0x5f,(socklen_t *)pcVar10);
            uVar5 = local_590._0_4_;
            token::destroy((token *)local_590);
            if (uVar5 == 0x72) {
              if (this_00->type_ == with_) {
                if (this_01->strict_mode_ == true) {
                  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_590);
                  std::operator<<((wostream *)local_590,
                                  "Strict mode code may not include a WithStatement");
                  local_608._0_8_ =
                       (this_01->source_).
                       super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  local_608._8_8_ =
                       (this_01->source_).
                       super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_)->
                      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_608._8_8_)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_)->
                      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_608._8_8_)->_M_use_count + 1;
                    }
                  }
                  local_5f8 = (pointer)CONCAT44((int)(this_01->lexer_).text_pos_,
                                                this_01->token_start_);
                  std::__cxx11::wstringbuf::str();
                  message._M_str = in_R9;
                  message._M_len = local_628._0_8_;
                  syntax_error((parser *)"parse_statement",(char *)0x3a7,(int)local_608,
                               (source_extend *)local_628._8_8_,message);
                }
                get_token(&local_288,this_01);
                token::destroy(&local_288);
                expect(&local_2b0,this_01,lparen,"parse_statement",0x3aa);
                token::destroy(&local_2b0);
                parse_expression((parser *)local_590);
                expect(&local_2d8,this_01,rparen,"parse_statement",0x3ac);
                token::destroy(&local_2d8);
                parse_statement((parser *)local_628,check_for_strict_mode);
                make_statement<mjs::with_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                          (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                 *)this_01,
                           (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                           local_590);
                goto LAB_0017700a;
              }
              accept((parser *)local_590,iVar7,(sockaddr *)0x63,(socklen_t *)pcVar10);
              uVar5 = local_590._0_4_;
              token::destroy((token *)local_590);
              if (uVar5 == 0x72) {
                accept((parser *)local_590,iVar7,(sockaddr *)0x66,(socklen_t *)pcVar10);
                uVar5 = local_590._0_4_;
                token::destroy((token *)local_590);
                if (uVar5 == 0x72) {
                  accept((parser *)local_590,iVar7,(sockaddr *)0x6a,(socklen_t *)pcVar10);
                  uVar5 = local_590._0_4_;
                  token::destroy((token *)local_590);
                  if (uVar5 == 0x72) {
                    accept((parser *)local_590,iVar7,(sockaddr *)0x3f,(socklen_t *)pcVar10);
                    uVar5 = local_590._0_4_;
                    token::destroy((token *)local_590);
                    if (uVar5 != 0x72) {
                      make_statement<mjs::debugger_statement>(this);
                      expect_semicolon_allow_insertion(this_01,"parse_statement",0x3f0);
                      goto LAB_00176d47;
                    }
                    parse_expression((parser *)local_628);
                    if (0 < (int)this_01->version_) {
                      accept((parser *)local_590,iVar7,(sockaddr *)0x24,(socklen_t *)pcVar10);
                      uVar5 = local_590._0_4_;
                      token::destroy((token *)local_590);
                      if (uVar5 != 0x72) {
                        iVar7 = (**(code **)((long)&((pointer)
                                                    ((syntax_node *)local_628._0_8_)->
                                                    _vptr_syntax_node)->field_2 + 8))();
                        uVar3 = local_628._0_8_;
                        if (iVar7 != 0) {
                          unhandled(this_01,"parse_statement",0x3f7);
                        }
                        parse_statement((parser *)local_590,check_for_strict_mode);
                        make_statement<mjs::labelled_statement,std::__cxx11::wstring_const&,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                                  (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)this_01,
                                   (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>
                                    *)(uVar3 + 0x20));
                        auVar12 = local_590;
                        goto LAB_00176f65;
                      }
                    }
                    if ((in_DL != '\0') &&
                       (bVar6 = is_strict_mode_directive((expression *)local_628._0_8_), bVar6)) {
                      this_01->strict_mode_ = true;
                    }
                    expect_semicolon_allow_insertion(this_01,"parse_statement",0x401);
                    make_statement<mjs::expression_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                              (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                     *)this_01);
                    local_598 = (undefined1  [8])local_628._0_8_;
                  }
                  else {
                    parse_block((parser *)local_598,check_for_strict_mode);
                    local_5b8._24_8_ = (element_type *)0x0;
                    local_5b8._16_8_ = (element_type *)0x0;
                    local_628._8_8_ = (source_extend *)0x0;
                    local_618 = (pointer)((ulong)local_618 & 0xffffffff00000000);
                    local_628._0_8_ = &local_618;
                    accept((parser *)local_590,iVar7,(sockaddr *)0x3a,(socklen_t *)pcVar10);
                    uVar5 = local_590._0_4_;
                    token::destroy((token *)local_590);
                    if (uVar5 != 0x72) {
                      expect(&local_3c8,this_01,lparen,"parse_statement",0x3df);
                      token::destroy(&local_3c8);
                      if ((this_01->strict_mode_ == true) &&
                         ((this_01->current_token_).type_ == identifier)) {
                        pwVar8 = token::text_abi_cxx11_(this_00);
                        pwVar2 = (pwVar8->_M_dataplus)._M_p;
                        local_608._0_8_ = (long)local_608 + 0x10;
                        std::__cxx11::wstring::_M_construct<wchar_t*>
                                  ((wstring *)local_608,pwVar2,pwVar2 + pwVar8->_M_string_length);
                        uVar3 = local_608._0_8_;
                        name._M_str = extraout_RDX;
                        name._M_len = local_608._0_8_;
                        bVar6 = is_strict_mode_unassignable_identifier((mjs *)local_608._8_8_,name);
                        if (bVar6) {
                          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_590);
                          pwVar9 = std::operator<<((wostream *)local_590,"\"");
                          local_5e0._M_allocated_capacity = local_608._8_8_;
                          local_5e0._8_8_ = local_608._0_8_;
                          cpp_quote_abi_cxx11_((wstring *)local_5c8,(mjs *)&local_5e0,s);
                          pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                             (pwVar9,(wchar_t *)local_5c8._0_8_,local_5c8._8_8_);
                          std::operator<<(pwVar9,
                                          "\" may not be used as an identifier in strict mode");
                          if ((element_type *)local_5c8._0_8_ != (element_type *)local_5b8) {
                            operator_delete((void *)local_5c8._0_8_,local_5b8._0_8_ * 4 + 4);
                          }
                          local_5e0._M_allocated_capacity =
                               (size_type)
                               (this_01->source_).
                               super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
                          local_5e0._8_8_ =
                               (this_01->source_).
                               super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._8_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._8_8_)->
                              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                             local_5e0._8_8_)->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e0._8_8_)->
                              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                             local_5e0._8_8_)->_M_use_count + 1;
                            }
                          }
                          local_5d0 = this_01->token_start_;
                          local_5cc = (undefined4)(this_01->lexer_).text_pos_;
                          std::__cxx11::wstringbuf::str();
                          message_00._M_str = in_R9;
                          message_00._M_len = local_5c8._0_8_;
                          syntax_error((parser *)"parse_statement",(char *)0x3e3,(int)&local_5e0,
                                       (source_extend *)local_5c8._8_8_,message_00);
                        }
                        if (uVar3 != (long)local_608 + 0x10) {
                          operator_delete((void *)uVar3,(long)local_5f8 * 4 + 4);
                        }
                      }
                      expect((token *)local_590,this_01,identifier,"parse_statement",0x3e6);
                      if ((local_590._0_4_ != 2) && (local_590._0_4_ != 4)) goto LAB_00177c1c;
                      std::__cxx11::wstring::_M_assign((wstring *)local_628);
                      token::destroy((token *)local_590);
                      pcVar10 = "parse_statement";
                      expect(&local_3f0,this_01,rparen,"parse_statement",999);
                      token::destroy(&local_3f0);
                      parse_block((parser *)local_590,check_for_strict_mode);
                      local_5b8._24_8_ = local_590;
                    }
                    accept((parser *)local_590,iVar7,(sockaddr *)0x4a,(socklen_t *)pcVar10);
                    uVar5 = local_590._0_4_;
                    token::destroy((token *)local_590);
                    if (uVar5 != 0x72) {
                      parse_block((parser *)local_590,check_for_strict_mode);
                      local_5b8._16_8_ = local_590;
                    }
                    make_statement<mjs::try_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::__cxx11::wstring&,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                              (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>
                                     *)this_01,
                               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                               local_598,
                               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                *)(local_5b8 + 0x18),
                               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                               local_628);
                    if ((pointer *)local_628._0_8_ != &local_618) {
                      operator_delete((void *)local_628._0_8_,(long)local_618 * 4 + 4);
                    }
                    if ((element_type *)local_5b8._16_8_ != (element_type *)0x0) {
                      (*(code *)(*(pointer *)local_5b8._16_8_)->_M_string_length)();
                    }
                    if ((element_type *)local_5b8._24_8_ != (element_type *)0x0) {
                      (*(code *)(*(pointer *)local_5b8._24_8_)->_M_string_length)();
                    }
                  }
                }
                else {
                  if (this_01->line_break_skipped_ == true) {
                    unhandled(this_01,"parse_statement",0x3d5);
                  }
                  parse_expression((parser *)local_590);
                  expect_semicolon_allow_insertion(this_01,"parse_statement",0x3d8);
                  make_statement<mjs::throw_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                            (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                   *)this_01);
                  local_598 = local_590;
                }
              }
              else {
                expect(&local_300,this_01,lparen,"parse_statement",0x3af);
                token::destroy(&local_300);
                parse_expression((parser *)local_5c8);
                expect(&local_328,this_01,rparen,"parse_statement",0x3b1);
                token::destroy(&local_328);
                pcVar10 = "parse_statement";
                expect(&local_350,this_01,lbrace,"parse_statement",0x3b2);
                token::destroy(&local_350);
                local_628._0_8_ =
                     (__uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>)0x0;
                local_628._8_8_ = (source_extend *)0x0;
                local_618 = (pointer)0x0;
                local_418 = 0;
                while( true ) {
                  accept((parser *)local_590,iVar7,(sockaddr *)0x31,(socklen_t *)pcVar10);
                  uVar5 = local_590._0_4_;
                  token::destroy((token *)local_590);
                  if (uVar5 != 0x72) break;
                  accept((parser *)local_590,iVar7,(sockaddr *)0x40,(socklen_t *)pcVar10);
                  uVar5 = local_590._0_4_;
                  token::destroy((token *)local_590);
                  if (uVar5 == 0x72) {
                    expect(&local_378,this_01,case_,"parse_statement",0x3b9);
                    token::destroy(&local_378);
                    parse_expression((parser *)local_590);
                    auVar11 = local_590;
                  }
                  else {
                    if ((local_418 & 1) != 0) {
                      unhandled(this_01,"parse_statement",0x3be);
                    }
                    local_418 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                    auVar11 = (undefined1  [8])0x0;
                  }
                  expect(&local_3a0,this_01,colon,"parse_statement",0x3c2);
                  token::destroy(&local_3a0);
                  local_608._0_8_ =
                       (__uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>)0x0;
                  local_608._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_5f8 = (pointer)0x0;
                  while( true ) {
                    uVar1 = this_00->type_ - case_;
                    pcVar10 = (char *)(ulong)uVar1;
                    if (((uVar1 < 0x3a) &&
                        ((0x200000000000081U >> ((ulong)pcVar10 & 0x3f) & 1) != 0)) ||
                       (this_00->type_ == rbrace)) break;
                    parse_statement((parser *)local_590,check_for_strict_mode);
                    std::
                    vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
                    ::
                    emplace_back<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                              ((vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
                                *)local_608,
                               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                               local_590);
                    if (local_590 != (undefined1  [8])0x0) {
                      (*(code *)(*(pointer *)local_590)->_M_string_length)();
                    }
                  }
                  local_588 = (undefined1  [8])local_608._0_8_;
                  aeStack_580[0]._0_8_ = local_608._8_8_;
                  aeStack_580[0].filename_._M_dataplus._M_p = (pointer)local_5f8;
                  local_608._0_8_ =
                       (__uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>)0x0;
                  local_608._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_5f8 = (pointer)0x0;
                  local_590 = auVar11;
                  std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::
                  emplace_back<mjs::case_clause>
                            ((vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)
                             local_628,(case_clause *)local_590);
                  std::
                  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                  ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                             *)local_588);
                  if (local_590 != (undefined1  [8])0x0) {
                    (*(code *)(*(pointer *)local_590)->_M_string_length)();
                  }
                  std::
                  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                  ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                             *)local_608);
                }
                make_statement<mjs::switch_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<mjs::case_clause,std::allocator<mjs::case_clause>>>
                          (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                 *)this_01,
                           (vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)local_5c8)
                ;
                std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::~vector
                          ((vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)local_628)
                ;
                local_598 = (undefined1  [8])local_5c8._0_8_;
              }
            }
            else {
              local_590 = (undefined1  [8])0x0;
              if ((this_01->line_break_skipped_ == false) &&
                 ((this_01->current_token_).type_ != semicolon)) {
                parse_expression((parser *)local_628);
                local_590 = (undefined1  [8])local_628._0_8_;
              }
              expect_semicolon_allow_insertion(this_01,"parse_statement",0x3a3);
              make_statement<mjs::return_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                        (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                              this_01);
              local_598 = local_590;
            }
            goto LAB_00177021;
          }
          get_label_abi_cxx11_((wstring *)local_590,this_01);
          expect_semicolon_allow_insertion(this_01,"parse_statement",0x39b);
          make_statement<mjs::break_statement,std::__cxx11::wstring>
                    (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)this_01);
        }
        else {
          get_label_abi_cxx11_((wstring *)local_590,this_01);
          expect_semicolon_allow_insertion(this_01,"parse_statement",0x397);
          make_statement<mjs::continue_statement,std::__cxx11::wstring>
                    (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)this_01);
        }
        if (local_590 != (undefined1  [8])(local_588 + 8)) {
          operator_delete((void *)local_590,aeStack_580[0]._0_8_ * 4 + 4);
        }
        goto LAB_00176d47;
      }
      expect(&local_170,this_01,lparen,"parse_statement",0x36f);
      token::destroy(&local_170);
      parse_expression((parser *)local_590);
      expect(&local_198,this_01,rparen,"parse_statement",0x371);
      token::destroy(&local_198);
      parse_statement((parser *)local_628,check_for_strict_mode);
      make_statement<mjs::while_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this_01,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_590);
    }
    else {
      parse_statement((parser *)local_590,check_for_strict_mode);
      expect(&local_f8,this_01,while_,"parse_statement",0x368);
      token::destroy(&local_f8);
      expect(&local_120,this_01,lparen,"parse_statement",0x369);
      token::destroy(&local_120);
      parse_expression((parser *)local_628);
      expect(&local_148,this_01,rparen,"parse_statement",0x36b);
      token::destroy(&local_148);
      expect_semicolon_allow_insertion(this_01,"parse_statement",0x36c);
      make_statement<mjs::do_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this_01,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_628);
    }
LAB_0017700a:
    local_598 = local_590;
    if ((element_type *)local_628._0_8_ != (element_type *)0x0) {
      (*(code *)((pointer)((syntax_node *)local_628._0_8_)->_vptr_syntax_node)->_M_string_length)();
      local_598 = local_590;
    }
  }
  else {
    expect(&local_80,this_01,lparen,"parse_statement",0x35f);
    token::destroy(&local_80);
    parse_expression((parser *)local_628);
    pcVar10 = "parse_statement";
    expect(&local_a8,this_01,rparen,"parse_statement",0x361);
    token::destroy(&local_a8);
    parse_statement((parser *)local_608,check_for_strict_mode);
    accept((parser *)&local_d0,iVar7,(sockaddr *)0x34,(socklen_t *)pcVar10);
    token::destroy(&local_d0);
    accept((parser *)local_590,iVar7,(sockaddr *)0x44,(socklen_t *)pcVar10);
    if (local_590._0_4_ == 0x72) {
      local_5c8._0_8_ = (element_type *)0x0;
    }
    else {
      parse_statement((parser *)local_5c8,check_for_strict_mode);
    }
    token::destroy((token *)local_590);
    make_statement<mjs::if_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this_01,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_628,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_608);
    auVar11 = (undefined1  [8])local_5c8._0_8_;
LAB_00176f55:
    auVar12 = (undefined1  [8])local_608._0_8_;
    if (auVar11 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)&((element_type *)auVar11)->ver_)->_M_string_length)();
      auVar12 = (undefined1  [8])local_608._0_8_;
    }
LAB_00176f65:
    local_598 = (undefined1  [8])local_628._0_8_;
    if (auVar12 != (undefined1  [8])0x0) {
      (*(code *)(*(pointer *)auVar12)->_M_string_length)();
      local_598 = (undefined1  [8])local_628._0_8_;
    }
  }
LAB_00177021:
  if (local_598 != (undefined1  [8])0x0) {
    (*(code *)((pointer)(((statement *)local_598)->super_syntax_node)._vptr_syntax_node)->
              _M_string_length)();
  }
LAB_00176d47:
  if (*local_410.stack_ != &local_410) {
    __assert_fail("stack_ == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x116,"mjs::parser::position_stack_node::~position_stack_node()");
  }
  *local_410.stack_ = local_410.prev_;
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr parse_statement(bool check_for_strict_mode = false) {
        RECORD_STATEMENT_START;
        // Statement :
        //  Block
        //  VariableStatement
        //  EmptyStatement
        //  ExpressionStatement
        //  IfStatement
        //  IterationStatement
        //  ContinueStatement
        //  BreakStatement
        //  ReturnStatement
        //  WithStatement
        //  LabelledStatement
        //  SwitchStatement
        //  ThrowStatement
        //  TryStatement

        if (current_token_type() == token_type::lbrace) {
            return parse_block();
        } else if (accept(token_type::function_)) {
            const auto id_extend = current_extend();
            auto id = EXPECT(token_type::identifier).text();
            auto [extend, params, block] = parse_function();
            assert(block->type() == statement_type::block);
            if (static_cast<const block_statement&>(*block).strict_mode()) {
                check_function_name(id, id_extend);
            }
            return make_statement<function_definition>(extend, id, std::move(params), std::move(block));
        } else if (accept(token_type::var_)) {
            auto dl = parse_variable_declaration_list();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<variable_statement>(std::move(dl));
        } else if (current_token_type() == token_type::semicolon) {
            get_token();
            return make_statement<empty_statement>();
        } else if (accept(token_type::if_)) {
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            auto if_s = parse_statement();
            accept(token_type::semicolon);
            auto else_s = accept(token_type::else_) ? parse_statement() : statement_ptr{};
            return make_statement<if_statement>(std::move(cond), std::move(if_s), std::move(else_s));
        } else if (/*version_ >= version::es3 && */accept(token_type::do_)) {
            auto s = parse_statement();
            EXPECT(token_type::while_);
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<do_statement>(std::move(cond), std::move(s));
        } else if (accept(token_type::while_)) {
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            return make_statement<while_statement>(std::move(cond), parse_statement());
        } else if (accept(token_type::for_)) {
            statement_ptr init{};
            expression_ptr cond{}, iter{};
            EXPECT(token_type::lparen);
            if (!accept(token_type::semicolon)) {
                // HACK: to support "NoIn" grammar :(
                supress_in_ = true;
                if (accept(token_type::var_)) {
                    init = make_statement<variable_statement>(parse_variable_declaration_list());
                } else {
                    init = make_statement<expression_statement>(parse_expression());
                }
                supress_in_ = false;
                if (accept(token_type::in_)) {
                    if (init->type() == statement_type::variable && static_cast<variable_statement&>(*init).l().size() != 1) {
                        // Only a single variable assigment is legal
                        UNHANDLED();
                    }

                    auto e = parse_expression();
                    EXPECT(token_type::rparen);
                    return make_statement<for_in_statement>(std::move(init), std::move(e), parse_statement());
                }
                EXPECT(token_type::semicolon);
            }
            if (!accept(token_type::semicolon)) {
                cond = parse_expression();
                EXPECT(token_type::semicolon);
            }
            if (!accept(token_type::rparen)) {
                iter = parse_expression();
                EXPECT(token_type::rparen);
            }
            return make_statement<for_statement>(std::move(init), std::move(cond), std::move(iter), parse_statement());
        } else if (accept(token_type::continue_)) {
            auto id = get_label();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<continue_statement>(std::move(id));
        } else if (accept(token_type::break_)) {
            auto id = get_label();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<break_statement>(std::move(id));
        } else if (accept(token_type::return_)) {
            // no line break before
            expression_ptr e{};
            if (!line_break_skipped_ && current_token_type() != token_type::semicolon) {
                e = parse_expression();
            }
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<return_statement>(std::move(e));
        } else if (current_token_type() == token_type::with_) {
            if (strict_mode_) {
                SYNTAX_ERROR("Strict mode code may not include a WithStatement");
            }
            get_token(); // Consume now that any syntax errors have been reported
            EXPECT(token_type::lparen);
            auto e = parse_expression();
            EXPECT(token_type::rparen);
            return make_statement<with_statement>(std::move(e), parse_statement());
        } else if (/*version_ >= version::es3 && */accept(token_type::switch_)) {
            EXPECT(token_type::lparen);
            auto switch_e = parse_expression();
            EXPECT(token_type::rparen);
            EXPECT(token_type::lbrace);
            clause_list cl;
            bool has_default = false;
            while (!accept(token_type::rbrace)) {
                // CaseClause
                expression_ptr e{};
                if (!accept(token_type::default_)) {
                    EXPECT(token_type::case_);
                    e = parse_expression();
                } else {
                    if (has_default) {
                        // TODO: Better error message when a switch has multiple default clauses
                        UNHANDLED();
                    }
                    has_default = true;
                }
                EXPECT(token_type::colon);
                statement_list sl;
                for (;;) {
                    const auto tt = current_token_type();
                    if (tt == token_type::rbrace
                        || tt == token_type::case_
                        || tt ==  token_type::default_
                        || tt == token_type::eof) {
                        break;
                    }
                    sl.emplace_back(parse_statement());
                }
                cl.push_back(case_clause{std::move(e), std::move(sl)});
            }
            return make_statement<switch_statement>(std::move(switch_e), std::move(cl));
        } else if (/*version_ >= version::es3 && */accept(token_type::throw_)) {
            // no line break before
            if (line_break_skipped_) {
                // TODO: Give better error message
                UNHANDLED();
            }
            auto e = parse_expression();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<throw_statement>(std::move(e));
        } else if (/*version_ >= version::es3 && */accept(token_type::try_)) {
            auto block = parse_block();
            statement_ptr catch_{}, finally_{};
            std::wstring catch_id;
            if (accept(token_type::catch_)) {
                EXPECT(token_type::lparen);
                if (strict_mode_ && current_token_type() == token_type::identifier) {
                    auto n = current_token().text();
                    if (is_strict_mode_unassignable_identifier(n)) {
                        SYNTAX_ERROR("\"" << cpp_quote(n) << "\" may not be used as an identifier in strict mode");
                    }
                }
                catch_id = EXPECT(token_type::identifier).text();
                EXPECT(token_type::rparen);
                catch_ = parse_block();
            }
            if (accept(token_type::finally_)) {
                finally_ = parse_block();
            }
            return make_statement<try_statement>(std::move(block), std::move(catch_), catch_id, std::move(finally_));
        } else if (/*version_ >= version::es5 && */accept(token_type::debugger_)) {
            auto s = make_statement<debugger_statement>();;
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return s;
        } else {
            auto e = parse_expression();
            if (version_ >= version::es3 && accept(token_type::colon)) {
                if (e->type() != expression_type::identifier) {
                    // TODO: Better error message when encountering an invalid label (or other invalid construct)
                    UNHANDLED();
                }
                return make_statement<labelled_statement>(static_cast<const identifier_expression&>(*e).id(), parse_statement());
            }
            if (check_for_strict_mode && is_strict_mode_directive(*e)) {
                strict_mode_ = true;
#ifdef PARSER_DEBUG
                std::wcout << e->extend() << ": Strict mode enabled\n";
#endif
            }
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<expression_statement>(std::move(e));
        }
    }